

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functor.hpp
# Opt level: O1

void __thiscall
Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
::Functor(Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
          *this)

{
  Tp local_58;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Functor(this,(Tf *)&local_38,&local_58,(cpTo)0x0);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

Functor() : Functor(Tf{}, Tp{}) {}